

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
          (Compiler *this,VariableID id,uint32_t *counter_id)

{
  Meta *pMVar1;
  ID local_2c [3];
  Meta *m;
  uint32_t *counter_id_local;
  Compiler *this_local;
  VariableID id_local;
  
  m = (Meta *)counter_id;
  counter_id_local = (uint32_t *)this;
  this_local._0_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
            (local_2c,(TypedID<(diligent_spirv_cross::Types)2> *)&this_local);
  pMVar1 = ParsedIR::find_meta(&this->ir,local_2c[0]);
  if ((pMVar1 == (Meta *)0x0) || (pMVar1->hlsl_magic_counter_buffer == 0)) {
    this_local._7_1_ = false;
  }
  else {
    *(uint32_t *)&(m->decoration).alias = pMVar1->hlsl_magic_counter_buffer;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::buffer_get_hlsl_counter_buffer(VariableID id, uint32_t &counter_id) const
{
	auto *m = ir.find_meta(id);

	// First, check for the proper decoration.
	if (m && m->hlsl_magic_counter_buffer != 0)
	{
		counter_id = m->hlsl_magic_counter_buffer;
		return true;
	}
	else
		return false;
}